

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindCommon.cxx
# Opt level: O2

bool __thiscall cmFindCommon::ComputeIfDebugModeWanted(cmFindCommon *this)

{
  cmMakefile *this_00;
  bool bVar1;
  cmake *pcVar2;
  undefined1 uVar3;
  allocator<char> local_41;
  string local_40;
  
  bVar1 = cmMakefile::GetDebugFindPkgMode(this->Makefile);
  uVar3 = 1;
  if (!bVar1) {
    this_00 = this->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"CMAKE_FIND_DEBUG_MODE",&local_41);
    bVar1 = cmMakefile::IsOn(this_00,&local_40);
    uVar3 = 1;
    if (!bVar1) {
      pcVar2 = cmMakefile::GetCMakeInstance(this->Makefile);
      uVar3 = pcVar2->DebugFindOutput;
    }
    std::__cxx11::string::~string((string *)&local_40);
  }
  return (bool)uVar3;
}

Assistant:

bool cmFindCommon::ComputeIfDebugModeWanted()
{
  return this->Makefile->GetDebugFindPkgMode() ||
    this->Makefile->IsOn("CMAKE_FIND_DEBUG_MODE") ||
    this->Makefile->GetCMakeInstance()->GetDebugFindOutput();
}